

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O0

Vector3 * __thiscall COLLADABU::Math::Quaternion::operator*(Quaternion *this,Vector3 *v)

{
  double *in_RSI;
  Vector3 *in_RDI;
  Vector3 qvec;
  Vector3 uuv;
  Vector3 uv;
  Vector3 *in_stack_ffffffffffffff58;
  Vector3 local_90;
  Vector3 local_78;
  Vector3 local_60;
  Vector3 local_48;
  Vector3 local_30 [2];
  
  Vector3::Vector3(local_30);
  Vector3::Vector3(&local_48);
  Vector3::Vector3(&local_60,in_RSI[1],in_RSI[2],in_RSI[3]);
  Vector3::crossProduct(in_stack_ffffffffffffff58,in_RDI);
  Vector3::operator=(local_30,&local_78);
  Vector3::crossProduct(in_stack_ffffffffffffff58,in_RDI);
  Vector3::operator=(&local_48,&local_90);
  Vector3::operator*=(local_30,*in_RSI * 2.0);
  Vector3::operator*=(&local_48,2.0);
  Vector3::operator+(in_stack_ffffffffffffff58,in_RDI);
  Vector3::operator+(in_stack_ffffffffffffff58,in_RDI);
  return in_RDI;
}

Assistant:

Vector3 Quaternion::operator* ( const Vector3& v ) const
        {
            // nVidia SDK implementation
            Vector3 uv, uuv;
            Vector3 qvec( x, y, z );
            uv = qvec.crossProduct( v );
            uuv = qvec.crossProduct( uv );
            uv *= ( 2.0f * w );
            uuv *= 2.0f;

            return v + uv + uuv;

        }